

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSliderConstraint.cpp
# Opt level: O2

btVector3 __thiscall btSliderConstraint::getAncorInA(btSliderConstraint *this)

{
  btVector3 bVar1;
  float local_64;
  btVector3 local_60;
  btTransform local_50;
  
  local_64 = (this->m_lowerLinLimit + this->m_upperLinLimit) * 0.5;
  local_50.m_basis.m_el[0] = operator*(&this->m_sliderAxis,&local_64);
  local_60 = operator+(&this->m_realPivotAInW,(btVector3 *)&local_50);
  btTransform::inverse
            (&local_50,
             &(((this->super_btTypedConstraint).m_rbA)->super_btCollisionObject).m_worldTransform);
  bVar1 = btTransform::operator()(&local_50,&local_60);
  return (btVector3)bVar1.m_floats;
}

Assistant:

btVector3 btSliderConstraint::getAncorInA(void)
{
	btVector3 ancorInA;
	ancorInA = m_realPivotAInW + (m_lowerLinLimit + m_upperLinLimit) * btScalar(0.5) * m_sliderAxis;
	ancorInA = m_rbA.getCenterOfMassTransform().inverse() * ancorInA;
	return ancorInA;
}